

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

int lws_h2_issue_preface(lws *wsi)

{
  lws_h2_netconn *plVar1;
  int iVar2;
  char *pcVar3;
  lws_h2_protocol_send *pps;
  int iVar4;
  
  plVar1 = (wsi->h2).h2n;
  if (plVar1 == (lws_h2_netconn *)0x0) {
    _lws_log(2,"%s: no valid h2n\n","lws_h2_issue_preface");
    iVar4 = 1;
  }
  else {
    iVar4 = 1;
    if ((plVar1->field_0xa9 & 8) == 0) {
      pcVar3 = lws_wsi_tag(wsi);
      _lws_log(0x10,"%s: %s: fd %d\n","lws_h2_issue_preface",pcVar3,(ulong)(uint)(wsi->desc).sockfd)
      ;
      iVar2 = lws_issue_raw(wsi,(uchar *)"PRI * HTTP/2.0\r\n\r\nSM\r\n\r\n",0x18);
      if (iVar2 == 0x18) {
        plVar1->field_0xa9 = plVar1->field_0xa9 | 8;
        lws_role_transition(wsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
        plVar1->count = 0;
        (wsi->txc).tx_cr = 0xffff;
        pps = (lws_h2_protocol_send *)lws_realloc((void *)0x0,0x38,"pps");
        if (pps != (lws_h2_protocol_send *)0x0) {
          pps->type = LWS_H2_PPS_MY_SETTINGS;
          lws_pps_schedule(wsi,pps);
          _lws_log(8,"%s: h2 client sending settings\n","lws_h2_issue_preface");
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
lws_h2_issue_preface(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;

	if (!h2n) {
		lwsl_warn("%s: no valid h2n\n", __func__);
		return 1;
	}

	if (h2n->sent_preface)
		return 1;

	lwsl_debug("%s: %s: fd %d\n", __func__, lws_wsi_tag(wsi), (int)wsi->desc.sockfd);

	if (lws_issue_raw(wsi, (uint8_t *)preface, strlen(preface)) !=
		(int)strlen(preface))
		return 1;

	h2n->sent_preface = 1;

	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_H2_WAITING_TO_SEND_HEADERS,
			    &role_ops_h2);

	h2n->count = 0;
	wsi->txc.tx_cr = 65535;

	/*
	 * we must send a settings frame
	 */
	pps = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
	if (!pps)
		return 1;
	lws_pps_schedule(wsi, pps);
	lwsl_info("%s: h2 client sending settings\n", __func__);

	return 0;
}